

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

void __thiscall ParserProbModelXML::ReadLRFs(ParserProbModelXML *this)

{
  xmlNodeSetPtr pxVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr node;
  pointer ppRVar3;
  unsigned_long uVar4;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  iterator __position;
  FactoredDecPOMDPDiscrete *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  bool bVar5;
  elm_type eVar6;
  Index IVar7;
  int iVar8;
  xmlXPathObjectPtr pxVar9;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar10;
  pair<ParserProbModelXML::elm_type,_unsigned_int> pVar11;
  Scope *this_02;
  Scope *this_03;
  size_t nrS;
  size_t nrJA;
  RewardModelMapping *this_04;
  ulong uVar12;
  mapped_type *pmVar13;
  EParse *pEVar14;
  long *plVar15;
  size_type *psVar16;
  long lVar17;
  uint __tmp;
  Index lrf;
  char *this_05;
  ParserProbModelXML *this_06;
  key_type *__k;
  _Alloc_hider this_07;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  double reward;
  int local_444;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_AsAll;
  vector<unsigned_int,_std::allocator<unsigned_int>_> AsAll;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  t1_deps;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ptr_values;
  vector<unsigned_int,_std::allocator<unsigned_int>_> As;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  t0_deps;
  vector<bool,_std::allocator<bool>_> factor_times;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Os;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Ys;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Xs;
  Scope O;
  Scope Y;
  Scope A;
  Scope X;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  vector<unsigned_long,_std::allocator<unsigned_long>_> factor_sizes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  factor_names;
  string sf_descr;
  Scope jaScope;
  string utility_var_name;
  string local_188;
  vector<unsigned_int,_std::allocator<unsigned_int>_> factor_values;
  string local_150;
  string local_130;
  xmlXPathObjectPtr local_110;
  xmlXPathObjectPtr local_108;
  xmlXPathObjectPtr local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_f8;
  string ag_descr;
  string local_d0;
  string local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  local_60;
  
  FactoredDecPOMDPDiscrete::InitializeInstantiationInformation(this->_m_fDecPOMDP);
  pxVar9 = GetNodesMatchingExpression
                     (this,(xmlChar *)
                           "/ProbModelXML/ProbNet/Potentials/Potential[@role=\'utility\']",
                      (xmlNodePtr)0x0);
  if (pxVar9 == (xmlXPathObjectPtr)0x0) {
    pEVar14 = (EParse *)__cxa_allocate_exception(0x28);
    EParse::EParse(pEVar14,"No reward potentials found in the model.");
LAB_0045ad26:
    __cxa_throw(pEVar14,&EParse::typeinfo,E::~E);
  }
  pxVar1 = pxVar9->nodesetval;
  local_110 = pxVar9;
  if (0 < pxVar1->nodeNr) {
    local_f8 = &this->_m_ASizes;
    lVar17 = 0;
    do {
      this_05 = "UtilityVariable";
      pxVar9 = GetNodesMatchingExpression(this,(xmlChar *)"UtilityVariable",pxVar1->nodeTab[lVar17])
      ;
      if (pxVar9 == (xmlXPathObjectPtr)0x0) {
        pEVar14 = (EParse *)__cxa_allocate_exception(0x28);
        EParse::EParse(pEVar14,"Found a reward table node with no codomain.");
        goto LAB_0045ad26;
      }
      local_100 = pxVar9;
      GetVariableName_abi_cxx11_
                (&utility_var_name,(ParserProbModelXML *)this_05,*pxVar9->nodesetval->nodeTab);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,utility_var_name._M_dataplus._M_p,
                 utility_var_name._M_dataplus._M_p + utility_var_name._M_string_length);
      pVar10 = GetParsedElement(this,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if (pVar10.first != REWARD) {
        pEVar14 = (EParse *)__cxa_allocate_exception(0x28);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t0_deps
                       ,"Found a reward table defined over non-reward variable \"",&utility_var_name
                      );
        plVar15 = (long *)std::__cxx11::string::append((char *)&t0_deps);
        local_b0._M_dataplus._M_p = (pointer)*plVar15;
        psVar16 = (size_type *)(plVar15 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar16) {
          local_b0.field_2._M_allocated_capacity = *psVar16;
          local_b0.field_2._8_8_ = plVar15[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar16;
        }
        local_b0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar16;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        EParse::EParse(pEVar14,&local_b0);
        __cxa_throw(pEVar14,&EParse::typeinfo,E::~E);
      }
      this_06 = (ParserProbModelXML *)0x508582;
      local_108 = GetNodesMatchingExpression(this,"Variables/Variable",pxVar1->nodeTab[lVar17]);
      pxVar2 = local_108->nodesetval;
      X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ptr_values.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ptr_values.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ptr_values.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      factor_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      factor_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      factor_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      lVar21 = (long)pxVar2->nodeNr;
      if (lVar21 < 1) {
        local_444 = 1;
      }
      else {
        lVar21 = lVar21 + 1;
        local_444 = 1;
        do {
          node = pxVar2->nodeTab[lVar21 + -2];
          GetVariableName_abi_cxx11_((string *)&t0_deps,this_06,node);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,
                     CONCAT44(t0_deps._M_t._M_impl._4_4_,t0_deps._M_t._M_impl._0_4_),
                     CONCAT44(t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                              t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
                     CONCAT44(t0_deps._M_t._M_impl._4_4_,t0_deps._M_t._M_impl._0_4_));
          pVar11 = GetParsedElement(this,&local_130);
          this_07._M_p = local_130._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          uVar20 = (ulong)pVar11 >> 0x20;
          eVar6 = pVar11.first;
          uVar19 = pVar11.second;
          if (eVar6 == STATE) {
            iVar8 = GetVariableTimeslice((ParserProbModelXML *)this_07._M_p,node);
            sf_descr._M_dataplus._M_p =
                 (pointer)(**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                                 super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                 ).super_MultiAgentDecisionProcess + 0xc0))
                                    (this->_m_fDecPOMDP,uVar20);
            if (iVar8 == 0) {
              t1_deps._M_t._M_impl._0_4_ = uVar19;
              if (X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&X,
                           (iterator)
                           X.super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(uint *)&t1_deps);
              }
              else {
                *X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish = uVar19;
                X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              t1_deps._M_t._M_impl._0_8_ = &Xs;
              std::
              vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
              ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                        ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                          *)&ptr_values,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&t1_deps);
            }
            else {
              t1_deps._M_t._M_impl._0_4_ = uVar19;
              if (Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&Y,
                           (iterator)
                           Y.super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(uint *)&t1_deps);
              }
              else {
                *Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish = uVar19;
                Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              t1_deps._M_t._M_impl._0_8_ = &Ys;
              std::
              vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
              ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                        ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                          *)&ptr_values,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&t1_deps);
            }
            std::vector<bool,_std::allocator<bool>_>::push_back(&factor_times,iVar8 != 0);
          }
          else {
            if (eVar6 == ACTION) {
              if (this->_m_asynchronousModel == false) {
                sf_descr._M_dataplus._M_p =
                     (pointer)(**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                                                                                          
                                                  super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                  ).super_MultiAgentDecisionProcess + 0x108))
                                        (this->_m_fDecPOMDP,uVar20);
              }
              else {
                sf_descr._M_dataplus._M_p =
                     (pointer)(this->_m_ASizes).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar20];
              }
              t1_deps._M_t._M_impl._0_4_ = uVar19;
              if (A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&A,
                           (iterator)
                           A.super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(uint *)&t1_deps);
              }
              else {
                *A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish = uVar19;
                A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              t1_deps._M_t._M_impl._0_8_ = &As;
              std::
              vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
              ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                        ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                          *)&ptr_values,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&t1_deps);
              bVar5 = false;
            }
            else {
              if (eVar6 != OBSERVATION) {
                pEVar14 = (EParse *)__cxa_allocate_exception(0x28);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &t1_deps,"Reward \"",&utility_var_name);
                plVar15 = (long *)std::__cxx11::string::append((char *)&t1_deps);
                local_d0._M_dataplus._M_p = (pointer)*plVar15;
                psVar16 = (size_type *)(plVar15 + 2);
                if ((size_type *)local_d0._M_dataplus._M_p == psVar16) {
                  local_d0.field_2._M_allocated_capacity = *psVar16;
                  local_d0.field_2._8_8_ = plVar15[3];
                  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                }
                else {
                  local_d0.field_2._M_allocated_capacity = *psVar16;
                }
                local_d0._M_string_length = plVar15[1];
                *plVar15 = (long)psVar16;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                EParse::EParse(pEVar14,&local_d0);
                __cxa_throw(pEVar14,&EParse::typeinfo,E::~E);
              }
              if (this->_m_asynchronousModel != false) {
                uVar20 = 0;
              }
              sf_descr._M_dataplus._M_p =
                   (pointer)(**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                                                                                      
                                                  super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                  ).super_MultiAgentDecisionProcess + 0x168))
                                      (this->_m_fDecPOMDP,uVar20);
              t1_deps._M_t._M_impl._0_4_ = uVar19;
              if (O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&O,
                           (iterator)
                           O.super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(uint *)&t1_deps);
              }
              else {
                *O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish = uVar19;
                O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              t1_deps._M_t._M_impl._0_8_ = &Os;
              std::
              vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
              ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                        ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>>
                          *)&ptr_values,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> **)&t1_deps);
              bVar5 = true;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back(&factor_times,bVar5);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&factor_names,(value_type *)&t0_deps);
          if (factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            this_06 = (ParserProbModelXML *)
                      factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&factor_sizes,
                       (iterator)
                       factor_sizes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(unsigned_long *)&sf_descr);
          }
          else {
            *factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)sf_descr._M_dataplus._M_p;
            this_06 = (ParserProbModelXML *)
                      (factor_sizes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1);
            factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)this_06;
          }
          local_444 = local_444 * (int)sf_descr._M_dataplus._M_p;
          if ((_Base_ptr *)CONCAT44(t0_deps._M_t._M_impl._4_4_,t0_deps._M_t._M_impl._0_4_) !=
              &t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            this_06 = (ParserProbModelXML *)
                      ((long)&(t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                              _M_color + 1);
            operator_delete((undefined1 *)
                            CONCAT44(t0_deps._M_t._M_impl._4_4_,t0_deps._M_t._M_impl._0_4_),
                            (ulong)this_06);
          }
          lVar21 = lVar21 + -1;
        } while (1 < lVar21);
      }
      t0_deps._M_t._M_impl._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&factor_values,
                 (long)factor_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)factor_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,
                 (value_type_conflict1 *)&t0_deps,(allocator_type *)&t1_deps);
      uVar20 = (ulong)pVar10 >> 0x20;
      this_02 = (Scope *)(**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                                super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                ).super_MultiAgentDecisionProcess + 0x280))
                                   (this->_m_fDecPOMDP,uVar20);
      this_03 = (Scope *)(**(code **)(*(long *)&(this->_m_fDecPOMDP->
                                                super_MultiAgentDecisionProcessDiscreteFactoredStates
                                                ).super_MultiAgentDecisionProcess + 0x288))
                                   (this->_m_fDecPOMDP,uVar20);
      Scope::SoftPrint_abi_cxx11_(&sf_descr,this_02);
      Scope::SoftPrint_abi_cxx11_(&ag_descr,this_03);
      lrf = pVar10.second;
      nrS = FactoredDecPOMDPDiscrete::GetNrXIs(this->_m_fDecPOMDP,lrf);
      nrJA = FactoredDecPOMDPDiscrete::GetNrAIs(this->_m_fDecPOMDP,lrf);
      this_04 = (RewardModelMapping *)operator_new(0x80);
      RewardModelMapping::RewardModelMapping(this_04,nrS,nrJA,&sf_descr,&ag_descr);
      ppRVar3 = (this->_m_fDecPOMDP->_m_LRFs).
                super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_fDecPOMDP->_m_LRFs).
                        super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppRVar3 >> 3) <= uVar20) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      ppRVar3[uVar20] = (RewardModel *)this_04;
      t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &t0_deps._M_t._M_impl.super__Rb_tree_header._M_header;
      t0_deps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      t1_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      t1_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      t1_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &t1_deps._M_t._M_impl.super__Rb_tree_header._M_header;
      t1_deps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      t1_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           t1_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           t0_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < local_444) {
        iVar8 = 0;
        do {
          if (factor_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              factor_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar21 = 0;
            uVar20 = 0;
            do {
              uVar12 = uVar20 + 0x3f;
              if (-1 < (long)uVar20) {
                uVar12 = uVar20;
              }
              __k = (key_type *)
                    ((long)&((factor_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar21
                    );
              uVar19 = factor_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar20];
              uVar4 = factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar20];
              if ((factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar12 >> 6) +
                    ((ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                   (uVar20 & 0x3f) & 1) == 0) {
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                          ::operator[](&t0_deps,__k);
              }
              else {
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                          ::operator[](&t1_deps,__k);
              }
              pmVar13->first = uVar19;
              pmVar13->second = (uint)uVar4;
              uVar20 = uVar20 + 1;
              lVar21 = lVar21 + 0x20;
            } while (uVar20 < (ulong)((long)factor_names.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)factor_names.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,utility_var_name._M_dataplus._M_p,
                     utility_var_name._M_dataplus._M_p + utility_var_name._M_string_length);
          __x = local_f8;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::_Rb_tree(&local_90,&t0_deps._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::_Rb_tree(&local_60,&t1_deps._M_t);
          reward = GetPotential(this,&local_150,
                                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                 *)&local_90,
                                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                 *)&local_60,true);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::~_Rb_tree(&local_60);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
          ::~_Rb_tree(&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (ptr_values.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              ptr_values.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar21 = 0;
            uVar20 = 0;
            do {
              this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                        ptr_values.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar20];
              __position._M_current = *(uint **)(this_00 + 8);
              if (__position._M_current == *(uint **)(this_00 + 0x10)) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          (this_00,__position,
                           (uint *)((long)factor_values.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar21));
              }
              else {
                *__position._M_current =
                     *(uint *)((long)factor_values.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar21);
                *(uint **)(this_00 + 8) = __position._M_current + 1;
              }
              uVar20 = uVar20 + 1;
              lVar21 = lVar21 + 4;
            } while (uVar20 < (ulong)((long)ptr_values.
                                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ptr_values.
                                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (this->_m_asynchronousModel == false) {
            FactoredDecPOMDPDiscrete::SetRewardForLRF
                      (this->_m_fDecPOMDP,lrf,&X,&Xs,&A,&As,&Y,&Ys,&O,&Os,reward);
          }
          else {
            jaScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            jaScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            jaScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((ulong)AsAll.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&jaScope,(iterator)0x0,
                       (uint *)&AsAll);
            if (As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              FactoredDecPOMDPDiscrete::SetRewardForLRF
                        (this->_m_fDecPOMDP,lrf,&X,&Xs,(Scope *)&AsAll,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&r_AsAll,&Y,&Ys,&O,
                         &Os,reward);
            }
            else {
              r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)r_AsAll.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        (&AsAll,(long)(this->_m_ASizes).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->_m_ASizes).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3,
                         (value_type_conflict1 *)&r_AsAll,(allocator_type *)&local_258);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&r_AsAll,__x);
              if ((long)A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start != 0) {
                lVar21 = (long)A.super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)A.super_SDT.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                lVar18 = 0;
                do {
                  uVar19 = A.super_SDT.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar18];
                  r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19] = 1;
                  AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19] =
                       As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar21 + (ulong)(lVar21 == 0) != lVar18);
              }
              do {
                IVar7 = IndexTools::IndividualToJointIndices(&AsAll,__x);
                this_01 = this->_m_fDecPOMDP;
                local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)operator_new(4);
                local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1;
                *local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start = IVar7;
                local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                FactoredDecPOMDPDiscrete::SetRewardForLRF
                          (this_01,lrf,&X,&Xs,&jaScope,&local_258,&Y,&Ys,&O,&Os,reward);
                if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != (Index *)0x0) {
                  operator_delete(local_258.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_258.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_258.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                bVar5 = IndexTools::Increment(&AsAll,&r_AsAll);
              } while (!bVar5);
            }
            if (r_AsAll.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(r_AsAll.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)r_AsAll.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)r_AsAll.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(AsAll.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)AsAll.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)AsAll.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (jaScope.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(jaScope.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)jaScope.super_SDT.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)jaScope.super_SDT.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          if (As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          if (Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          if (Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          IndexTools::Increment(&factor_values,&factor_sizes);
          iVar8 = iVar8 + 1;
        } while (iVar8 != local_444);
      }
      xmlXPathFreeObject(local_100);
      xmlXPathFreeObject(local_108);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree(&t1_deps._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::~_Rb_tree(&t0_deps._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ag_descr._M_dataplus._M_p != &ag_descr.field_2) {
        operator_delete(ag_descr._M_dataplus._M_p,ag_descr.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sf_descr._M_dataplus._M_p != &sf_descr.field_2) {
        operator_delete(sf_descr._M_dataplus._M_p,sf_descr.field_2._M_allocated_capacity + 1);
      }
      if (factor_values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(factor_values.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)factor_values.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)factor_values.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        factor_times.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&factor_names);
      if (factor_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(factor_sizes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)factor_sizes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)factor_sizes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (ptr_values.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(ptr_values.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)ptr_values.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)ptr_values.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)Os.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(O.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)O.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)O.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(Y.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)Y.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)Y.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(A.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)A.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)A.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(X.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)X.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)X.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)utility_var_name._M_dataplus._M_p != &utility_var_name.field_2) {
        operator_delete(utility_var_name._M_dataplus._M_p,
                        utility_var_name.field_2._M_allocated_capacity + 1);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pxVar1->nodeNr);
  }
  xmlXPathFreeObject(local_110);
  return;
}

Assistant:

void ParserProbModelXML::ReadLRFs()
{
    _m_fDecPOMDP->InitializeInstantiationInformation();

    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Potentials/Potential[@role='utility']";
    xmlXPathObjectPtr reward_potentials = GetNodesMatchingExpression(xpath);

    if(reward_potentials == NULL){
        throw EParse("No reward potentials found in the model.");
    }

    xmlNodeSetPtr potentials_nodeset = reward_potentials->nodesetval;
    for(int i = 0; i < potentials_nodeset->nodeNr; i++)
    {
        xmlXPathObjectPtr utility_var_node = GetNodesMatchingExpression((xmlChar*) "UtilityVariable",potentials_nodeset->nodeTab[i]);
        if(utility_var_node == NULL)
            throw EParse("Found a reward table node with no codomain.");
            
        string utility_var_name = GetVariableName(utility_var_node->nodesetval->nodeTab[0]);

        std::pair<ParserProbModelXML::elm_type, Index> elm;
        elm = GetParsedElement(utility_var_name);
        if(elm.first != REWARD)
            throw EParse("Found a reward table defined over non-reward variable \"" + utility_var_name + "\".");
        Index LRFix = elm.second; //LRF index

        xmlXPathObjectPtr vars = GetNodesMatchingExpression((xmlChar*) "Variables/Variable",potentials_nodeset->nodeTab[i]);
        xmlNodeSetPtr var_nodeset = vars->nodesetval;

        Scope X, A, Y, O;
        vector<Index> Xs, As, Ys, Os;
        vector<vector<Index>* > ptr_values;
        vector<size_t> factor_sizes;
        vector<string> factor_names;
        vector<bool> factor_times;
        int nValues = 1;
        for(int j = var_nodeset->nodeNr-1; j >= 0; j--) //have to store everything bottom-up
        {
            size_t size;
            xmlNodePtr node = var_nodeset->nodeTab[j];
            string var_name = GetVariableName(node);
            elm = GetParsedElement(var_name);
            switch(elm.first)
            {
                case STATE:
                    {
                        int timeslice = GetVariableTimeslice(node);
                        size = _m_fDecPOMDP->GetNrValuesForFactor(elm.second);
                        if(timeslice == 0)
                        {
                            X.Insert(elm.second);
                            ptr_values.push_back(&Xs);
                            factor_times.push_back(0);
                        }
                        else
                        {
                            Y.Insert(elm.second);
                            ptr_values.push_back(&Ys);
                            factor_times.push_back(1);
                        }
                    }
                    break;
                case ACTION:
                    if(!_m_asynchronousModel){
                        size = _m_fDecPOMDP->GetNrActions(elm.second);
                    }else{
                        size = _m_ASizes[elm.second];
                    }
                    A.Insert(elm.second);
                    ptr_values.push_back(&As);
                    factor_times.push_back(0);
                    break;
                case OBSERVATION:
                    if(!_m_asynchronousModel)
                        size = _m_fDecPOMDP->GetNrObservations(elm.second);
                    else
                        size = _m_fDecPOMDP->GetNrObservations(0);
                    O.Insert(elm.second);
                    ptr_values.push_back(&Os);
                    factor_times.push_back(1);
                    break;
                default:
                    throw EParse("Reward \"" + utility_var_name + "\" depends on unrecognized factors.");
            }
            factor_names.push_back(var_name);
            factor_sizes.push_back(size);
            nValues *=size;
        }
        vector<Index> factor_values(factor_names.size(), 0);        

        const Scope& sfSC = _m_fDecPOMDP->GetStateFactorScopeForLRF(LRFix);
        const Scope& agSC = _m_fDecPOMDP->GetAgentScopeForLRF(LRFix);
        string sf_descr = sfSC.SoftPrint();
        string ag_descr = agSC.SoftPrint();
        size_t nrXIs = _m_fDecPOMDP->GetNrXIs(LRFix);
        size_t nrAIs = _m_fDecPOMDP->GetNrAIs(LRFix);
        
        RewardModelMapping* RMe = 
            new RewardModelMapping(nrXIs, nrAIs, sf_descr, ag_descr);
        _m_fDecPOMDP->SetRM(LRFix, RMe);

        map<string, pair<Index, Index> > t0_deps;
        map<string, pair<Index, Index> > t1_deps;
        for(int j = 0; j < nValues; j++)
        {
            for(size_t k = 0; k < factor_names.size(); k++)
            {
              if(factor_times[k] == 0)
                t0_deps[factor_names[k]] = make_pair(factor_values[k], factor_sizes[k]);
              else
                t1_deps[factor_names[k]] = make_pair(factor_values[k], factor_sizes[k]);
            }

            double r = GetPotential(utility_var_name, t0_deps, t1_deps, true);

            for(size_t k = 0; k < ptr_values.size(); k++)
            {
                ptr_values[k]->push_back(factor_values[k]);
            }

            if(!_m_asynchronousModel)
                _m_fDecPOMDP->SetRewardForLRF(LRFix, X, Xs, A, As, Y, Ys, O, Os, r);
            else{
                Scope jaScope;
                jaScope.Insert(0);
                
                if(As.size() > 0){
                    ///now we have to go over all joint actions which map to A, As...
                    vector<Index> AsAll(_m_ASizes.size(), 0);
                    vector<size_t> r_AsAll = _m_ASizes;
                    for(size_t i = 0; i < A.size(); i++){
                        r_AsAll[A[i]] = 1; ///this prevents Increment from going over the variables already in the scope.
                        AsAll[A[i]] = As[i];
                    }
                    do{
                       Index jaI = IndexTools::IndividualToJointIndices(AsAll,_m_ASizes);
                        _m_fDecPOMDP->SetRewardForLRF(LRFix, X, Xs, jaScope, vector<Index>(1,jaI), Y, Ys, O, Os, r);
                    }while(! IndexTools::Increment( AsAll, r_AsAll ));
                }
                else
                {
                    _m_fDecPOMDP->SetRewardForLRF(LRFix, X, Xs, Scope(), vector<Index>(), Y, Ys, O, Os, r);
                }
            }
                
            Xs.clear();
            As.clear();
            Ys.clear();
            Os.clear();
            if(DEBUG_PARSE)
            {
                cout << "X: " << X.SoftPrint() << "->";
                for(size_t k = 0; k < Xs.size(); k++)
                    cout << Xs[k] << " ";
                cout << endl << "Y: " << Y.SoftPrint() << "->";
                for(size_t k = 0; k < Ys.size(); k++)
                    cout << Ys[k] << " ";
                cout << endl << "A: " << A.SoftPrint() << "->";
                for(size_t k = 0; k < As.size(); k++)
                    cout << As[k] << " ";
                cout << endl << "O: " << O.SoftPrint() << "->";
                for(size_t k = 0; k < Os.size(); k++)
                    cout << Os[k] << " ";
                cout << endl;

                cout << "LRF " << LRFix << " has sf scope " << sf_descr << " and ag scope " << ag_descr << " and for indexes ";
                    for(size_t k = 0; k < factor_values.size(); k++)
                      cout << factor_values[k] << " ";
                    cout << "it has reward " << r << endl;
            }
            IndexTools::Increment(factor_values, factor_sizes);
        }

        xmlXPathFreeObject (utility_var_node);
        xmlXPathFreeObject (vars);
    }

    xmlXPathFreeObject (reward_potentials);
}